

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void testing::anon_unknown_18::PrintByteSegmentInObjectTo
               (uchar *obj_bytes,size_t start,size_t count,ostream *os)

{
  size_t j;
  size_t i;
  ostream *poStack_28;
  char text [5];
  ostream *os_local;
  size_t count_local;
  size_t start_local;
  uchar *obj_bytes_local;
  
  poStack_28 = os;
  memset((void *)((long)&i + 3),0,5);
  for (j = 0; j != count; j = j + 1) {
    if (j != 0) {
      if ((start + j & 1) == 0) {
        std::operator<<(poStack_28,' ');
      }
      else {
        std::operator<<(poStack_28,'-');
      }
    }
    snprintf((char *)((long)&i + 3),5,"%02X",(ulong)obj_bytes[start + j]);
    std::operator<<(poStack_28,(char *)((long)&i + 3));
  }
  return;
}

Assistant:

void PrintByteSegmentInObjectTo(const unsigned char* obj_bytes, size_t start,
                                size_t count, ostream* os) {
  char text[5] = "";
  for (size_t i = 0; i != count; i++) {
    const size_t j = start + i;
    if (i != 0) {
      // Organizes the bytes into groups of 2 for easy parsing by
      // human.
      if ((j % 2) == 0)
        *os << ' ';
      else
        *os << '-';
    }
    GTEST_SNPRINTF_(text, sizeof(text), "%02X", obj_bytes[j]);
    *os << text;
  }
}